

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page-queue.c
# Opt level: O0

void mi_page_queue_remove(mi_page_queue_t *queue,mi_page_t *page)

{
  mi_heap_t *pmVar1;
  mi_page_t *in_RSI;
  long *in_RDI;
  mi_heap_t *heap;
  mi_page_queue_t *in_stack_00000038;
  mi_heap_t *in_stack_00000040;
  
  pmVar1 = mi_page_heap(in_RSI);
  if (in_RSI->prev != (mi_page_s *)0x0) {
    in_RSI->prev->next = in_RSI->next;
  }
  if (in_RSI->next != (mi_page_s *)0x0) {
    in_RSI->next->prev = in_RSI->prev;
  }
  if (in_RSI == (mi_page_t *)in_RDI[1]) {
    in_RDI[1] = (long)in_RSI->prev;
  }
  if (in_RSI == (mi_page_t *)*in_RDI) {
    *in_RDI = (long)in_RSI->next;
    mi_heap_queue_first_update(in_stack_00000040,in_stack_00000038);
  }
  pmVar1->page_count = pmVar1->page_count - 1;
  in_RSI->next = (mi_page_s *)0x0;
  in_RSI->prev = (mi_page_s *)0x0;
  mi_page_set_in_full(in_RSI,false);
  return;
}

Assistant:

static void mi_page_queue_remove(mi_page_queue_t* queue, mi_page_t* page) {
  mi_assert_internal(page != NULL);
  mi_assert_expensive(mi_page_queue_contains(queue, page));
  mi_assert_internal(mi_page_block_size(page) == queue->block_size ||
                      (mi_page_is_large_or_huge(page) && mi_page_queue_is_huge(queue)) ||
                        (mi_page_is_in_full(page) && mi_page_queue_is_full(queue)));
  mi_heap_t* heap = mi_page_heap(page);

  if (page->prev != NULL) page->prev->next = page->next;
  if (page->next != NULL) page->next->prev = page->prev;
  if (page == queue->last)  queue->last = page->prev;
  if (page == queue->first) {
    queue->first = page->next;
    // update first
    mi_assert_internal(mi_heap_contains_queue(heap, queue));
    mi_heap_queue_first_update(heap,queue);
  }
  heap->page_count--;
  page->next = NULL;
  page->prev = NULL;
  // mi_atomic_store_ptr_release(mi_atomic_cast(void*, &page->heap), NULL);
  mi_page_set_in_full(page,false);
}